

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

D_ParseNode * ambiguity_abort_fn(D_Parser *pp,int n,D_ParseNode **v)

{
  PNode *local_38;
  int local_24;
  int i;
  D_ParseNode **v_local;
  int n_local;
  D_Parser *pp_local;
  
  if (d_verbose_level != 0) {
    for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
      if (v[local_24] == (D_ParseNode *)0x0) {
        local_38 = (PNode *)0x0;
      }
      else {
        local_38 = (PNode *)(v[local_24] + -2);
      }
      print_paren((Parser *)pp,local_38);
      printf("\n");
    }
  }
  d_fail("unresolved ambiguity line %d file %s",(ulong)(uint)((*v)->start_loc).line,
         ((*v)->start_loc).pathname);
  return *v;
}

Assistant:

D_ParseNode *ambiguity_abort_fn(D_Parser *pp, int n, D_ParseNode **v) {
  int i;
  if (d_verbose_level) {
    for (i = 0; i < n; i++) {
      print_paren((Parser *)pp, D_ParseNode_to_PNode(v[i]));
      printf("\n");
    }
  }
  d_fail("unresolved ambiguity line %d file %s", v[0]->start_loc.line, v[0]->start_loc.pathname);
  return v[0];
}